

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Function * dxil_spv::get_entry_point_function(MDNode *node)

{
  bool bVar1;
  MDOperand *this;
  ConstantAsMetadata *this_00;
  Constant *value;
  MDOperand *func_node;
  MDNode *node_local;
  
  if (node == (MDNode *)0x0) {
    node_local = (MDNode *)0x0;
  }
  else {
    this = LLVMBC::MDNode::getOperand(node,0);
    bVar1 = LLVMBC::MDOperand::operator_cast_to_bool(this);
    if (bVar1) {
      this_00 = LLVMBC::cast<LLVMBC::ConstantAsMetadata>(this);
      value = LLVMBC::ConstantAsMetadata::getValue(this_00);
      node_local = (MDNode *)LLVMBC::dyn_cast<LLVMBC::Function>(&value->super_Value);
    }
    else {
      node_local = (MDNode *)0x0;
    }
  }
  return (Function *)node_local;
}

Assistant:

static llvm::Function *get_entry_point_function(llvm::MDNode *node)
{
	if (!node)
		return nullptr;

	auto &func_node = node->getOperand(0);

	if (func_node)
		return llvm::dyn_cast<llvm::Function>(llvm::cast<llvm::ConstantAsMetadata>(func_node)->getValue());
	else
		return nullptr;
}